

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::NumericRangeInfo,_false>::StartListValue
          (RangeInfoStruct<duckdb::NumericRangeInfo,_false> *this,idx_t row_idx)

{
  sel_t *psVar1;
  
  if ((long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    return 0;
  }
  psVar1 = (this->vdata[0].sel)->sel_vector;
  if (psVar1 != (sel_t *)0x0) {
    row_idx = (idx_t)psVar1[row_idx];
  }
  return *(TYPE *)(this->vdata[0].data + row_idx * 8);
}

Assistant:

typename OP::TYPE StartListValue(idx_t row_idx) {
		if (args.ColumnCount() == 1) {
			return OP::DefaultStart();
		} else {
			auto data = (typename OP::TYPE *)vdata[0].data;
			auto idx = vdata[0].sel->get_index(row_idx);
			return data[idx];
		}
	}